

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::BinaryReader::read<float,float>(BinaryReader *this,pair<float,_float> *t)

{
  size_t sVar1;
  pointer puVar2;
  size_t sVar3;
  runtime_error *this_00;
  
  puVar2 = (this->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) <
      this->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    t->first = *(float *)(puVar2 + this->currentEntityOffset);
    sVar3 = this->currentEntityOffset;
    sVar1 = sVar3 + 4;
    this->currentEntityOffset = sVar1;
    puVar2 = (this->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar3 + 8 <=
        (ulong)((long)(this->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2)) {
      t->second = *(float *)(puVar2 + sVar1);
      this->currentEntityOffset = this->currentEntityOffset + 4;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void copyBytes(T *t, size_t numBytes)
    {
      if ((currentEntityOffset + numBytes) > currentEntityData.size())
        throw std::runtime_error("invalid read attempt by entity - not enough data in data block!");
      memcpy((void *)t,(void *)((char*)currentEntityData.data()+currentEntityOffset),numBytes);
      currentEntityOffset += numBytes;
    }